

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<unsigned_short,signed_char,1>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *t,char *u,unsigned_short *result)

{
  bool bVar1;
  undefined2 *in_RDX;
  char *in_RSI;
  ushort *in_RDI;
  
  if (*in_RSI == '\0') {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<signed_char,_true>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = (short)((long)(ulong)*in_RDI % (long)(int)*in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }